

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O2

void __thiscall CSHA512::CSHA512(CSHA512 *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->bytes = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    anon_unknown.dwarf_222f21::sha512::Initialize(this->s);
    return;
  }
  __stack_chk_fail();
}

Assistant:

CSHA512::CSHA512()
{
    sha512::Initialize(s);
}